

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::
basic_json_cursor<char,_jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<char>_>
::read_to(basic_json_cursor<char,_jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<char>_>
          *this,basic_json_visitor<char> *visitor,error_code *ec)

{
  staj_event_type sVar1;
  bool bVar2;
  int value;
  basic_staj_event<char> *pbVar3;
  error_code *in_RDX;
  long *in_RDI;
  ser_context *in_stack_00000028;
  basic_json_visitor<char> *in_stack_00000030;
  error_code *in_stack_00000098;
  ser_context *in_stack_000000a0;
  basic_json_visitor<char> *in_stack_000000a8;
  basic_staj_event<char> *in_stack_000000b0;
  
  pbVar3 = (basic_staj_event<char> *)(**(code **)(*in_RDI + 0x20))();
  sVar1 = basic_staj_event<char>::event_type(pbVar3);
  bVar2 = is_begin_container(sVar1);
  if (bVar2) {
    basic_json_parser<char,_std::allocator<char>_>::cursor_mode
              ((basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 9),false);
    value = basic_json_parser<char,_std::allocator<char>_>::level
                      ((basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 9));
    basic_json_parser<char,_std::allocator<char>_>::mark_level
              ((basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 9),value);
    basic_staj_visitor<char>::event((basic_staj_visitor<char> *)(in_RDI + 0x28));
    basic_staj_event<char>::send_json_event
              (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
    bVar2 = std::error_code::operator_cast_to_bool(in_RDX);
    if (!bVar2) {
      read_next(this,visitor,ec);
      basic_json_parser<char,_std::allocator<char>_>::cursor_mode
                ((basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 9),true);
      basic_json_parser<char,_std::allocator<char>_>::mark_level
                ((basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 9),0);
      pbVar3 = (basic_staj_event<char> *)(**(code **)(*in_RDI + 0x20))();
      sVar1 = basic_staj_event<char>::event_type(pbVar3);
      if (sVar1 == begin_object) {
        basic_json_visitor<char>::end_object(in_stack_00000030,in_stack_00000028);
      }
      else {
        basic_json_visitor<char>::end_array(in_stack_00000030,in_stack_00000028);
      }
    }
  }
  else {
    basic_staj_visitor<char>::event((basic_staj_visitor<char> *)(in_RDI + 0x28));
    basic_staj_event<char>::send_json_event
              (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
  }
  return;
}

Assistant:

void read_to(basic_json_visitor<CharT>& visitor,
        std::error_code& ec) override
    {
        if (is_begin_container(current().event_type()))
        {
            parser_.cursor_mode(false);
            parser_.mark_level(parser_.level());
            cursor_visitor_.event().send_json_event(visitor, *this, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return;
            }
            read_next(visitor, ec);
            parser_.cursor_mode(true);
            parser_.mark_level(0);
            if (current().event_type() == staj_event_type::begin_object)
            {
                cursor_visitor_.end_object(*this);
            }
            else
            {
                cursor_visitor_.end_array(*this);
            }
        }
        else
        {
            cursor_visitor_.event().send_json_event(visitor, *this, ec);
        }
    }